

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

int32_t u_charDigitValue_63(UChar32 c)

{
  uint uVar1;
  int iVar2;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int32_t value;
  uint32_t props;
  UChar32 c_local;
  
  uVar1 = c >> 5;
  if ((uint)c < 0xd800) {
    local_24 = (uint)propsTrie_index[(int)uVar1] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar2 = 0;
      if (c < 0xdc00) {
        iVar2 = 0x140;
      }
      local_28 = (uint)propsTrie_index[(int)(iVar2 + uVar1)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0x110000) {
          local_30 = (uint)propsTrie_index
                           [(int)((uint)propsTrie_index[(c >> 0xb) + 0x820] + (uVar1 & 0x3f))] * 4 +
                     (c & 0x1fU);
        }
        else {
          local_30 = 0x53c8;
        }
        local_2c = local_30;
      }
      else {
        local_2c = 0x11f4;
      }
      local_28 = local_2c;
    }
    local_24 = local_28;
  }
  props = (propsTrie_index[local_24] >> 6) - 1;
  if (9 < (int)props) {
    props = 0xffffffff;
  }
  return props;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_charDigitValue(UChar32 c) {
    uint32_t props;
    int32_t value;
    GET_PROPS(c, props);
    value=(int32_t)GET_NUMERIC_TYPE_VALUE(props)-UPROPS_NTV_DECIMAL_START;
    if(value<=9) {
        return value;
    } else {
        return -1;
    }
}